

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlDocPtr xmlRelaxNGCleanupDoc(xmlRelaxNGParserCtxtPtr ctxt,xmlDocPtr doc)

{
  xmlNodePtr root_00;
  xmlNodePtr root;
  xmlDocPtr doc_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  root_00 = xmlDocGetRootElement(doc);
  if (root_00 == (xmlNodePtr)0x0) {
    xmlRngPErr(ctxt,(xmlNodePtr)doc,0x3fe,"xmlRelaxNGParse: %s is empty\n",ctxt->URL,(xmlChar *)0x0)
    ;
    ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
  }
  else {
    xmlRelaxNGCleanupTree(ctxt,root_00);
    ctxt_local = (xmlRelaxNGParserCtxtPtr)doc;
  }
  return (xmlDocPtr)ctxt_local;
}

Assistant:

static xmlDocPtr
xmlRelaxNGCleanupDoc(xmlRelaxNGParserCtxtPtr ctxt, xmlDocPtr doc)
{
    xmlNodePtr root;

    /*
     * Extract the root
     */
    root = xmlDocGetRootElement(doc);
    if (root == NULL) {
        xmlRngPErr(ctxt, (xmlNodePtr) doc, XML_RNGP_EMPTY, "xmlRelaxNGParse: %s is empty\n",
                   ctxt->URL, NULL);
        return (NULL);
    }
    xmlRelaxNGCleanupTree(ctxt, root);
    return (doc);
}